

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_scanline_p.h
# Opt level: O2

void __thiscall agg::scanline_p8::add_cell(scanline_p8 *this,int x,uint cover)

{
  span *psVar1;
  cover_type *pcVar2;
  
  *this->m_cover_ptr = (cover_type)cover;
  psVar1 = this->m_cur_span;
  if ((this->m_last_x + 1 == x) && (0 < psVar1->len)) {
    psVar1->len = psVar1->len + 1;
    pcVar2 = this->m_cover_ptr;
  }
  else {
    this->m_cur_span = psVar1 + 1;
    pcVar2 = this->m_cover_ptr;
    psVar1[1].covers = pcVar2;
    psVar1[1].x = (coord_type)x;
    psVar1[1].len = 1;
  }
  this->m_last_x = x;
  this->m_cover_ptr = pcVar2 + 1;
  return;
}

Assistant:

void add_cell(int x, unsigned cover)
        {
            *m_cover_ptr = (cover_type)cover;
            if(x == m_last_x+1 && m_cur_span->len > 0)
            {
                m_cur_span->len++;
            }
            else
            {
                m_cur_span++;
                m_cur_span->covers = m_cover_ptr;
                m_cur_span->x = (int16)x;
                m_cur_span->len = 1;
            }
            m_last_x = x;
            m_cover_ptr++;
        }